

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O3

string * __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::DecodeRemaining
          (string *__return_storage_ptr__,NumericCharacterEntity *this,string *s,size_t start)

{
  pointer pcVar1;
  ulong uVar2;
  string *this_00;
  size_t start_00;
  stringstream ss;
  char local_200;
  undefined7 uStack_1ff;
  long local_1f8;
  long local_1f0 [2];
  string *local_1e0;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (s->_M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__cxx11::string::substr((ulong)&local_200,(ulong)s);
    local_1e0 = __return_storage_ptr__;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,(char *)CONCAT71(uStack_1ff,local_200),local_1f8);
    if ((long *)CONCAT71(uStack_1ff,local_200) != local_1f0) {
      operator_delete((long *)CONCAT71(uStack_1ff,local_200),local_1f0[0] + 1);
    }
    start_00 = start + 1;
    uVar2 = s->_M_string_length;
    if (start_00 < uVar2) {
      do {
        pcVar1 = (s->_M_dataplus)._M_p;
        if (start_00 < uVar2 - 3 && pcVar1[start_00] == '&') {
          this_00 = &local_1d8;
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,pcVar1,pcVar1 + uVar2);
          start_00 = NextDecodedChar((NumericCharacterEntity *)this_00,(stringstream *)local_1b8,
                                     &local_1d8,start_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          local_200 = pcVar1[start_00];
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_200,1);
        }
        start_00 = start_00 + 1;
        uVar2 = s->_M_string_length;
      } while (start_00 < uVar2);
    }
    __return_storage_ptr__ = local_1e0;
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SubjectFormatter::NumericCharacterEntity::DecodeRemaining(std::string s, size_t start)
{
    if (s.empty())
    {
        return "";
    }

    std::stringstream ss;
    ss << s.substr(0, start);

    for (size_t i = start + 1; i < s.length(); i++)
    {
        char c = s.at(i);

        if (c == '&' && i < s.length() - 3)
        {
            i = NextDecodedChar(ss, s, i);
        }
        else
        {
            ss << c;
        }
    }

    return ss.str();
}